

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStems<signed_char>
               (char *label_id,char *xs,char *ys,int count,double y_ref,int offset,int stride)

{
  undefined1 local_78 [8];
  GetterXsYRef<signed_char> get_base;
  GetterXsYs<signed_char> get_mark;
  int stride_local;
  int offset_local;
  double y_ref_local;
  int count_local;
  char *ys_local;
  char *xs_local;
  char *label_id_local;
  
  GetterXsYs<signed_char>::GetterXsYs
            ((GetterXsYs<signed_char> *)&get_base.Stride,xs,ys,count,offset,stride);
  GetterXsYRef<signed_char>::GetterXsYRef
            ((GetterXsYRef<signed_char> *)local_78,xs,y_ref,count,offset,stride);
  PlotStemsEx<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>>
            (label_id,(GetterXsYs<signed_char> *)&get_base.Stride,
             (GetterXsYRef<signed_char> *)local_78);
  return;
}

Assistant:

void PlotStems(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    GetterXsYs<T> get_mark(xs,ys,count,offset,stride);
    GetterXsYRef<T> get_base(xs,y_ref,count,offset,stride);
    PlotStemsEx(label_id, get_mark, get_base);
}